

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

int httplib::detail::get_header_value_int(Headers *headers,char *key,int def)

{
  int iVar1;
  char *__nptr;
  const_iterator cVar2;
  int *piVar3;
  ulong uVar4;
  undefined8 uVar5;
  allocator local_49;
  key_type local_48;
  
  uVar4 = (ulong)(uint)def;
  std::__cxx11::string::string((string *)&local_48,key,&local_49);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&headers->_M_t,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar2._M_node != &(headers->_M_t)._M_impl.super__Rb_tree_header) {
    __nptr = *(char **)(cVar2._M_node + 2);
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    *piVar3 = 0;
    uVar4 = strtol(__nptr,(char **)&local_48,10);
    if (local_48._M_dataplus._M_p == __nptr) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((long)(int)uVar4 == uVar4) && (*piVar3 != 0x22)) {
      if (*piVar3 == 0) {
        *piVar3 = iVar1;
      }
      goto LAB_00149815;
    }
    uVar5 = std::__throw_out_of_range("stoi");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar5);
  }
LAB_00149815:
  return (int)uVar4;
}

Assistant:

inline int get_header_value_int(const Headers& headers, const char* key, int def = 0)
{
    auto it = headers.find(key);
    if (it != headers.end()) {
        return std::stoi(it->second);
    }
    return def;
}